

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  int iVar3;
  xpath_node *it;
  ulong uVar4;
  undefined7 extraout_var;
  xpath_node *pxVar5;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar6;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  long lVar7;
  xpath_node *pxVar8;
  xpath_node *end_00;
  long lVar9;
  xpath_node *pxVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  xml_node_struct *local_78;
  xml_attribute_struct *pxStack_70;
  xpath_node *local_60;
  xpath_node *local_58;
  long local_50;
  xpath_node local_48;
  
LAB_0069554e:
  local_58 = end + -1;
LAB_0069555c:
  uVar4 = (long)end - (long)begin >> 4;
  if (0x10 < (long)uVar4) {
    pxVar6 = (xpath_node *)(&begin->_node + (uVar4 & 0xfffffffffffffffe));
    bVar2 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar6,begin,(xpath_node *)pred);
    pxVar10 = local_58;
    pxVar5 = pxVar6;
    pxVar8 = begin;
    if (bVar2) {
      pxVar5 = begin;
      pxVar8 = pxVar6;
    }
    bVar2 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)local_58,pxVar5,rhs);
    if (bVar2) {
      pxVar5 = pxVar10;
    }
    bVar2 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)pxVar5,pxVar8,rhs_00);
    if (bVar2) {
      pxVar5 = pxVar8;
    }
    local_48._node._root = (pxVar5->_node)._root;
    local_48._attribute._attr = (pxVar5->_attribute)._attr;
    local_50 = -(long)begin;
    lVar9 = 0;
    pxVar6 = extraout_RDX;
    pxVar8 = begin;
    pxVar10 = end;
    local_60 = begin;
LAB_006955da:
    do {
      lVar7 = (long)end - (long)pxVar10;
      lVar11 = (long)&(pxVar10->_node)._root + local_50;
      while( true ) {
        pxVar5 = begin;
        end_00 = pxVar10;
        if (pxVar10 <= pxVar8) goto LAB_00695690;
        bVar2 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)pxVar8,&local_48,pxVar6);
        pxVar6 = extraout_RDX_00;
        if (bVar2) {
          pxVar8 = pxVar8 + 1;
          goto LAB_006955da;
        }
        auVar12._0_4_ = -(uint)(*(int *)&(pxVar8->_node)._root == (int)local_48._node._root);
        auVar12._4_4_ =
             -(uint)(*(int *)((long)&(pxVar8->_node)._root + 4) == local_48._node._root._4_4_);
        auVar12._8_4_ =
             -(uint)(*(int *)&(pxVar8->_attribute)._attr == (int)local_48._attribute._attr);
        auVar12._12_4_ =
             -(uint)(*(int *)((long)&(pxVar8->_attribute)._attr + 4) ==
                    local_48._attribute._attr._4_4_);
        auVar13._4_4_ = auVar12._0_4_;
        auVar13._0_4_ = auVar12._4_4_;
        auVar13._8_4_ = auVar12._12_4_;
        auVar13._12_4_ = auVar12._8_4_;
        iVar3 = movmskpd((int)CONCAT71(extraout_var,bVar2),auVar13 & auVar12);
        if (iVar3 == 3) break;
        local_78 = (pxVar8->_node)._root;
        pxStack_70 = (pxVar8->_attribute)._attr;
        pxVar1 = pxVar10[-1]._attribute._attr;
        (pxVar8->_node)._root = pxVar10[-1]._node._root;
        (pxVar8->_attribute)._attr = pxVar1;
        pxVar10[-1]._node._root = local_78;
        pxVar10[-1]._attribute._attr = pxStack_70;
        pxVar10 = pxVar10 + -1;
        lVar7 = lVar7 + 0x10;
        lVar11 = lVar11 + -0x10;
      }
      local_78 = (local_60->_node)._root;
      pxStack_70 = (local_60->_attribute)._attr;
      pxVar1 = (pxVar8->_attribute)._attr;
      (local_60->_node)._root = (pxVar8->_node)._root;
      (local_60->_attribute)._attr = pxVar1;
      local_60 = local_60 + 1;
      (pxVar8->_node)._root = local_78;
      (pxVar8->_attribute)._attr = pxStack_70;
      pxVar8 = pxVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while( true );
  }
  if (begin == end) {
    return;
  }
  pxVar6 = begin;
  goto LAB_00695701;
LAB_00695690:
  for (; lVar9 != 0; lVar9 = lVar9 + -0x10) {
    local_78 = (pxVar5->_node)._root;
    pxStack_70 = (pxVar5->_attribute)._attr;
    pxVar1 = end_00[-1]._attribute._attr;
    (pxVar5->_node)._root = end_00[-1]._node._root;
    (pxVar5->_attribute)._attr = pxVar1;
    end_00[-1]._node._root = local_78;
    end_00[-1]._attribute._attr = pxStack_70;
    lVar11 = lVar11 + -0x10;
    pxVar5 = pxVar5 + 1;
    end_00 = end_00 + -1;
  }
  if (lVar7 < lVar11) goto LAB_006956dc;
  sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (begin,end_00,(document_order_comparator *)pxVar6);
  pred = (document_order_comparator *)extraout_RDX_01;
  begin = pxVar10;
  goto LAB_0069555c;
LAB_006956dc:
  sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
            (pxVar10,end,(document_order_comparator *)pxVar6);
  pred = (document_order_comparator *)extraout_RDX_02;
  end = end_00;
  goto LAB_0069554e;
LAB_00695701:
  pxVar8 = pxVar6 + 1;
  if (pxVar8 == end) {
    return;
  }
  local_78 = (pxVar8->_node)._root;
  pxStack_70 = pxVar6[1]._attribute._attr;
  pxVar6 = pxVar8;
  while (begin < pxVar6) {
    pxVar10 = pxVar6 + -1;
    bVar2 = anon_unknown_0::document_order_comparator::operator()
                      ((document_order_comparator *)&local_78,pxVar10,(xpath_node *)pred);
    pred = (document_order_comparator *)extraout_RDX_03;
    if (!bVar2) break;
    pxVar1 = pxVar6[-1]._attribute._attr;
    (pxVar6->_node)._root = (pxVar10->_node)._root;
    (pxVar6->_attribute)._attr = pxVar1;
    pxVar6 = pxVar10;
  }
  (pxVar6->_node)._root = local_78;
  (pxVar6->_attribute)._attr = pxStack_70;
  pxVar6 = pxVar8;
  goto LAB_00695701;
}

Assistant:

PUGI_IMPL_FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}